

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O3

size_t jessilib::find<char8_t,char16_t,false>
                 (basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_substring)

{
  int iVar1;
  int iVar2;
  char8_t *pcVar3;
  size_t sVar4;
  char8_t *pcVar5;
  char16_t *pcVar6;
  char8_t *pcVar7;
  long lVar8;
  char8_t *pcVar9;
  jessilib *pjVar10;
  jessilib *this;
  char8_t *pcVar11;
  wchar32 wVar12;
  char16_t *pcVar13;
  decode_result dVar14;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  
  pcVar6 = in_substring._M_str;
  pcVar7 = (char8_t *)in_substring._M_len;
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  if (pcVar7 == (char8_t *)0x0) {
    pcVar3 = (char8_t *)0x0;
  }
  else {
    pcVar3 = (char8_t *)0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pcVar7 == (char8_t *)0x1) {
        in_string_00._M_str._0_2_ = *pcVar6;
        in_string_00._M_str._2_6_ = 0;
        sVar4 = find<char8_t,false>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar4;
      }
      pcVar5 = (char8_t *)0x0;
      pcVar3 = pcVar7;
      pcVar11 = pcVar7;
      pcVar13 = pcVar6;
      pjVar10 = this;
      pcVar9 = in_string_00._M_len;
LAB_002ae651:
      do {
        in_string_01._M_str = pcVar3;
        in_string_01._M_len = (size_t)in_string_00._M_len;
        dVar14 = decode_codepoint_utf8<char8_t>(this,in_string_01);
        pcVar3 = (char8_t *)dVar14.units;
        wVar12 = (wchar32)(ushort)*pcVar13;
        lVar8 = 1;
        if (((pcVar11 != (char8_t *)0x1) && ((wVar12 & 0xfc00U) == 0xd800)) &&
           (((ushort)pcVar13[1] & 0xfc00) == 0xdc00)) {
          wVar12 = (uint)(ushort)*pcVar13 * 0x400 + (uint)(ushort)pcVar13[1] + L'\xfca02400';
          lVar8 = 2;
        }
        if (pcVar3 == (char8_t *)0x0) break;
        if (dVar14.codepoint == wVar12) {
LAB_002ae6d1:
          if (pcVar11 + -lVar8 == (char8_t *)0x0) {
            return (size_t)pcVar5;
          }
          in_string_00._M_len = in_string_00._M_len + (long)pcVar3;
          this = this + -(long)pcVar3;
          pcVar11 = pcVar11 + -lVar8;
          pcVar13 = pcVar13 + lVar8;
          if (this != (jessilib *)0x0) goto LAB_002ae651;
        }
        else {
          iVar1 = jessilib::fold(dVar14.codepoint);
          iVar2 = jessilib::fold(wVar12);
          if (iVar1 == iVar2) goto LAB_002ae6d1;
        }
        in_string_00._M_len = pcVar9 + (long)pcVar3;
        pcVar5 = pcVar5 + (long)pcVar3;
        this = pjVar10 + -(long)pcVar3;
        pcVar3 = pcVar7;
        pcVar11 = pcVar7;
        pcVar13 = pcVar6;
        pjVar10 = this;
        pcVar9 = in_string_00._M_len;
      } while (this != (jessilib *)0x0);
      pcVar3 = (char8_t *)0xffffffffffffffff;
    }
  }
  return (size_t)pcVar3;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}